

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Int64Parameter::MergeFrom(Int64Parameter *this,Int64Parameter *from)

{
  void *pvVar1;
  LogMessage *other;
  Int64Range *pIVar2;
  Int64Set *pIVar3;
  Int64Range *from_00;
  Int64Set *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/Parameters.pb.cc"
               ,0x14f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->defaultvalue_ != 0) {
    this->defaultvalue_ = from->defaultvalue_;
  }
  if (from->_oneof_case_[0] == 0xb) {
    if (this->_oneof_case_[0] != 0xb) {
      clear_AllowedValues(this);
      this->_oneof_case_[0] = 0xb;
      pIVar3 = (Int64Set *)operator_new(0x28);
      Int64Set::Int64Set(pIVar3);
      (this->AllowedValues_).set_ = pIVar3;
    }
    pIVar3 = (this->AllowedValues_).set_;
    if (from->_oneof_case_[0] == 0xb) {
      from_01 = (from->AllowedValues_).set_;
    }
    else {
      from_01 = Int64Set::default_instance();
    }
    Int64Set::MergeFrom(pIVar3,from_01);
  }
  else if (from->_oneof_case_[0] == 10) {
    if (this->_oneof_case_[0] != 10) {
      clear_AllowedValues(this);
      this->_oneof_case_[0] = 10;
      pIVar2 = (Int64Range *)operator_new(0x28);
      Int64Range::Int64Range(pIVar2);
      (this->AllowedValues_).range_ = pIVar2;
    }
    pIVar2 = (this->AllowedValues_).range_;
    if (from->_oneof_case_[0] == 10) {
      from_00 = (from->AllowedValues_).range_;
    }
    else {
      from_00 = Int64Range::default_instance();
    }
    Int64Range::MergeFrom(pIVar2,from_00);
  }
  return;
}

Assistant:

void Int64Parameter::MergeFrom(const Int64Parameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Int64Parameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.defaultvalue() != 0) {
    set_defaultvalue(from.defaultvalue());
  }
  switch (from.AllowedValues_case()) {
    case kRange: {
      mutable_range()->::CoreML::Specification::Int64Range::MergeFrom(from.range());
      break;
    }
    case kSet: {
      mutable_set()->::CoreML::Specification::Int64Set::MergeFrom(from.set());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
}